

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::ModelProto_SentencePiece::InternalSwap
          (ModelProto_SentencePiece *this,ModelProto_SentencePiece *other)

{
  undefined8 uVar1;
  InternalMetadata *this_00;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__b;
  InternalMetadata *in_RSI;
  ExtensionSet *in_RDI;
  string *in_stack_ffffffffffffff28;
  InternalMetadata *in_stack_ffffffffffffff30;
  ExtensionSet *this_01;
  ExtensionSet *in_stack_ffffffffffffff70;
  
  google::protobuf::internal::ExtensionSet::Swap(in_stack_ffffffffffffff70,in_RDI);
  this_00 = in_RSI + 1;
  uVar1._0_2_ = in_RDI->flat_capacity_;
  uVar1._2_2_ = in_RDI->flat_size_;
  uVar1._4_4_ = *(undefined4 *)&in_RDI->field_0xc;
  if (((uint)uVar1 & 1) != 1) {
    if (((uint)this_00->ptr_ & 1) != 1) goto LAB_00461208;
  }
  if (((uint)this_00->ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadata::
    PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>(this_00)
    ;
  }
  else {
    google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
              (in_RSI);
  }
  google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
LAB_00461208:
  std::swap<unsigned_int>((uint *)&in_RDI[1].map_,(uint *)(in_RSI + 5));
  this_01 = in_RDI + 2;
  __b = (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(in_RSI + 6);
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::MessageLite::GetArena((MessageLite *)this_01);
  std::swap<google::protobuf::internal::TaggedPtr<std::__cxx11::string>>
            ((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01,__b);
  std::swap<float>((float *)&in_RDI[2].flat_capacity_,(float *)(in_RSI + 7));
  std::swap<int>((int *)&in_RDI[2].field_0xc,(int *)((long)&in_RSI[7].ptr_ + 4));
  return;
}

Assistant:

void ModelProto_SentencePiece::InternalSwap(ModelProto_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(score_, other->score_);
  swap(type_, other->type_);
}